

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int32_t intersect_skewed_uint16_cardinality
                  (uint16_t *small,size_t size_s,uint16_t *large,size_t size_l)

{
  int iVar1;
  int iVar2;
  ushort *puVar3;
  size_t sVar4;
  size_t sVar6;
  uint16_t min;
  size_t sVar5;
  
  if (size_s == 0) {
    return 0;
  }
  min = *small;
  iVar1 = 0;
  sVar6 = 0;
  sVar4 = 0;
  puVar3 = large;
  do {
    sVar5 = sVar4;
    while( true ) {
      sVar4 = sVar5 + 1;
      if (*puVar3 < min) break;
      if (*puVar3 <= min) {
        iVar1 = iVar1 + 1;
        if (size_s == sVar4) {
          return iVar1;
        }
        min = small[sVar4];
        iVar2 = advanceUntil(large,(int32_t)sVar6,(int32_t)size_l,min);
        goto joined_r0x00101d25;
      }
      if (size_s == sVar4) {
        return iVar1;
      }
      min = small[sVar4];
      sVar5 = sVar4;
    }
    iVar2 = advanceUntil(large,(int32_t)sVar6,(int32_t)size_l,min);
    sVar4 = sVar5;
joined_r0x00101d25:
    sVar6 = (size_t)iVar2;
    if (sVar6 == size_l) {
      return iVar1;
    }
    puVar3 = large + sVar6;
  } while( true );
}

Assistant:

int32_t intersect_skewed_uint16_cardinality(const uint16_t *small,
                                            size_t size_s,
                                            const uint16_t *large,
                                            size_t size_l) {
    size_t pos = 0, idx_l = 0, idx_s = 0;

    if (0 == size_s) {
        return 0;
    }

    uint16_t val_l = large[idx_l], val_s = small[idx_s];

    while (true) {
        if (val_l < val_s) {
            idx_l = advanceUntil(large, (int32_t)idx_l, (int32_t)size_l, val_s);
            if (idx_l == size_l) break;
            val_l = large[idx_l];
        } else if (val_s < val_l) {
            idx_s++;
            if (idx_s == size_s) break;
            val_s = small[idx_s];
        } else {
            pos++;
            idx_s++;
            if (idx_s == size_s) break;
            val_s = small[idx_s];
            idx_l = advanceUntil(large, (int32_t)idx_l, (int32_t)size_l, val_s);
            if (idx_l == size_l) break;
            val_l = large[idx_l];
        }
    }

    return (int32_t)pos;
}